

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JHandler.h
# Opt level: O2

void __thiscall JHandler::JHandler(JHandler *this)

{
  std::make_shared<JHandler::url>();
  std::make_shared<JHandler::metadata>();
  (this->error_msg)._M_dataplus._M_p = (pointer)&(this->error_msg).field_2;
  (this->error_msg)._M_string_length = 0;
  (this->error_msg).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

JHandler() = default;